

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

Binary * i2p::DecodeI2PBase64(string *i2p_b64)

{
  string_view str;
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string *std_b64;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> decoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *fmt;
  string *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  string local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fmt = local_28;
  args = in_RDI;
  SwapBase64(in_stack_ffffffffffffffa0);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  str._M_str = in_stack_ffffffffffffffa8;
  str._M_len = (size_t)in_stack_ffffffffffffffa0;
  DecodeBase64(str);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     in_stack_ffffffffffffff28);
  if (bVar1) {
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator*
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_ffffffffffffff28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xf68f70);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(in_stack_ffffffffffffff28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (Binary *)args;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>(fmt,args);
    std::runtime_error::runtime_error(this,local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static Binary DecodeI2PBase64(const std::string& i2p_b64)
{
    const std::string& std_b64 = SwapBase64(i2p_b64);
    auto decoded = DecodeBase64(std_b64);
    if (!decoded) {
        throw std::runtime_error(strprintf("Cannot decode Base64: \"%s\"", i2p_b64));
    }
    return std::move(*decoded);
}